

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyOpenGL.hpp
# Opt level: O0

void __thiscall tracy::GpuCtx::Collect(GpuCtx *this)

{
  undefined8 uVar1;
  QueueItem *pQVar2;
  bool bVar3;
  atomic<unsigned_long> *paVar4;
  atomic<unsigned_long> *paVar5;
  ExplicitProducer *pEVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  QueueItem *item_1;
  atomic<unsigned_long> *__tail_1;
  ExplicitProducer *__token_1;
  index_t __magic_1;
  uint64_t time;
  int local_2c4 [2];
  GLint available;
  GpuCtx *pGStack_2b8;
  ScopedZone ___tracy_scoped_zone;
  GpuCtx *this_local;
  QueueItem *item;
  atomic<unsigned_long> *__tail;
  ExplicitProducer *__token;
  index_t __magic;
  SourceLocationData *local_288;
  long local_280;
  QueueItem *local_278;
  QueueItem *item_3;
  atomic<unsigned_long> *__tail_3;
  ExplicitProducer *__token_3;
  index_t __magic_3;
  QueueItem *item_2;
  atomic<unsigned_long> *__tail_2;
  ExplicitProducer *__token_2;
  index_t __magic_2;
  ExplicitProducer *local_220;
  ExplicitProducer *local_218;
  ExplicitProducer *local_210;
  ExplicitProducer **local_1f8;
  ExplicitProducer *local_1f0;
  ExplicitProducer **local_1e8;
  ExplicitProducer *local_1e0;
  ExplicitProducer **local_1d8;
  ExplicitProducer *local_1d0;
  undefined1 local_1b1;
  QueueItem *local_1b0;
  undefined1 local_1a1;
  QueueItem *local_1a0;
  undefined1 local_191;
  QueueItem *local_190;
  long local_178;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_170;
  long local_168;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_160;
  index_t local_158;
  anon_union_31_76_853bdc15_for_QueueItem_1 *local_150;
  uint64_t rdx_1;
  uint64_t rax_1;
  uint64_t rdx_2;
  uint64_t rax_2;
  uint64_t rdx;
  uint64_t rax;
  uint64_t *local_110;
  memory_order __b_5;
  int local_dc;
  memory_order __b_7;
  QueueItem *local_d0;
  undefined1 *local_c8;
  memory_order local_c0;
  int local_bc;
  memory_order __b_1;
  atomic<unsigned_long> *local_b0;
  undefined1 *local_a8;
  memory_order local_a0;
  int local_9c;
  memory_order __b_3;
  atomic<unsigned_long> *local_90;
  ExplicitProducer *local_88;
  memory_order local_80;
  int local_7c;
  memory_order __b_2;
  ExplicitProducer *local_70;
  memory_order local_68;
  int local_64;
  memory_order __b;
  ExplicitProducer *local_58;
  memory_order local_50;
  int local_4c;
  memory_order __b_6;
  memory_order __b_4;
  uint8_t local_21;
  uint8_t *local_20;
  uint16_t local_12;
  uint16_t *local_10;
  
  local_280 = (long)&available + 3;
  local_288 = &Collect::__tracy_source_location144;
  __magic._7_1_ = 1;
  available._3_1_ = 1;
  pGStack_2b8 = this;
  pEVar6 = GetToken();
  paVar4 = &(pEVar6->super_ProducerBase).tailIndex;
  local_1e8 = &__token;
  paVar5 = &(pEVar6->super_ProducerBase).tailIndex;
  local_64 = 0;
  local_218 = pEVar6;
  local_1e0 = pEVar6;
  ___b = paVar5;
  local_68 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_64 - 1U < 2) {
    local_70 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else if (local_64 == 5) {
    local_70 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  else {
    local_70 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
  }
  *local_1e8 = local_70;
  bVar3 = moodycamel::details::cqUnlikely(((ulong)*local_1e8 & 0xffff) == 0);
  if (bVar3) {
    moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
    ExplicitProducer::enqueue_begin_alloc(pEVar6,(index_t)*local_1e8);
  }
  local_1a0 = moodycamel::
              ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
              Block::operator[]((pEVar6->super_ProducerBase).tailBlock,(index_t)*local_1e8);
  local_1a1 = 0xf;
  (local_1a0->hdr).field_0.type = ZoneBegin;
  local_160 = &local_1a0->field_1;
  uVar1 = rdtsc();
  rax_2 = CONCAT44(extraout_var,(int)((ulong)uVar1 >> 0x20));
  rdx = CONCAT44((int)((ulong)local_1a0 >> 0x20),(int)uVar1);
  local_168 = (rax_2 << 0x20) + rdx;
  (local_160->frameMark).time = local_168;
  local_110 = &(local_1a0->field_1).zoneBegin.srcloc;
  rax = (uint64_t)local_288;
  *local_110 = (uint64_t)local_288;
  ___b_1 = (undefined1 *)((long)&(__token->super_ProducerBase)._vptr_ProducerBase + 1);
  local_bc = 3;
  local_b0 = paVar4;
  local_c0 = std::operator&(memory_order_release,__memory_order_mask);
  if (local_bc == 3) {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  else if (local_bc == 5) {
    LOCK();
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
    UNLOCK();
  }
  else {
    (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_1;
  }
  local_c8 = ___b_1;
  if (this->m_tail == this->m_head) {
    local_2c4[1] = 1;
  }
  else {
    while (this->m_tail != this->m_head) {
      (*gl3wProcs.ptr[0xf9])((ulong)this->m_query[this->m_tail],0x8867,local_2c4);
      if (local_2c4[0] == 0) {
        local_2c4[1] = 1;
        goto LAB_00403434;
      }
      (*gl3wProcs.ptr[0xfa])((ulong)this->m_query[this->m_tail],0x8866,&__magic_1);
      pEVar6 = GetToken();
      paVar4 = &(pEVar6->super_ProducerBase).tailIndex;
      local_1d8 = &__token_1;
      paVar5 = &(pEVar6->super_ProducerBase).tailIndex;
      local_7c = 0;
      local_210 = pEVar6;
      local_1d0 = pEVar6;
      ___b_2 = paVar5;
      local_80 = std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_7c - 1U < 2) {
        local_88 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
      }
      else if (local_7c == 5) {
        local_88 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
      }
      else {
        local_88 = (ExplicitProducer *)(paVar5->super___atomic_base<unsigned_long>)._M_i;
      }
      *local_1d8 = local_88;
      bVar3 = moodycamel::details::cqUnlikely(((ulong)*local_1d8 & 0xffff) == 0);
      if (bVar3) {
        moodycamel::
        ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
        ExplicitProducer::enqueue_begin_alloc(pEVar6,(index_t)*local_1d8);
      }
      local_190 = moodycamel::
                  ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  ::Block::operator[]((pEVar6->super_ProducerBase).tailBlock,(index_t)*local_1d8);
      local_191 = 0x2e;
      (local_190->hdr).field_0.type = GpuTime;
      local_150 = &local_190->field_1;
      local_158 = __magic_1;
      (local_150->srcloc).name = __magic_1;
      local_10 = &(local_190->field_1).zoneTextFat.size;
      local_12 = (uint16_t)this->m_tail;
      *local_10 = local_12;
      local_20 = &(local_190->field_1).messageColor.b;
      local_21 = this->m_context;
      *local_20 = local_21;
      ___b_3 = (undefined1 *)((long)&(__token_1->super_ProducerBase)._vptr_ProducerBase + 1);
      local_9c = 3;
      local_90 = paVar4;
      local_a0 = std::operator&(memory_order_release,__memory_order_mask);
      local_a8 = ___b_3;
      if (local_9c == 3) {
        (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_3;
      }
      else if (local_9c == 5) {
        LOCK();
        (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_3;
        UNLOCK();
      }
      else {
        (paVar4->super___atomic_base<unsigned_long>)._M_i = (__int_type)___b_3;
      }
      this->m_tail = this->m_tail + 1 & 0xffff;
    }
    local_2c4[1] = 0;
  }
LAB_00403434:
  __magic_3 = (long)&available + 3;
  if ((available._3_1_ & 1) != 0) {
    pEVar6 = GetToken();
    item_3 = (QueueItem *)&(pEVar6->super_ProducerBase).tailIndex;
    local_1f8 = &__token_3;
    paVar4 = &(pEVar6->super_ProducerBase).tailIndex;
    local_4c = 0;
    __tail_3 = (atomic<unsigned_long> *)pEVar6;
    local_220 = pEVar6;
    local_1f0 = pEVar6;
    ___b_6 = paVar4;
    local_50 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_4c - 1U < 2) {
      local_58 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_4c == 5) {
      local_58 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_58 = (ExplicitProducer *)(paVar4->super___atomic_base<unsigned_long>)._M_i;
    }
    *local_1f8 = local_58;
    bVar3 = moodycamel::details::cqUnlikely(((ulong)*local_1f8 & 0xffff) == 0);
    if (bVar3) {
      moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
      ::ExplicitProducer::enqueue_begin_alloc(pEVar6,(index_t)*local_1f8);
    }
    local_278 = moodycamel::
                ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
                Block::operator[]((pEVar6->super_ProducerBase).tailBlock,(index_t)*local_1f8);
    pQVar2 = item_3;
    local_1b1 = 0x11;
    (local_278->hdr).field_0.type = ZoneEnd;
    local_170 = &local_278->field_1;
    uVar1 = rdtsc();
    rax_1 = CONCAT44(extraout_var_00,(int)((ulong)uVar1 >> 0x20));
    rdx_2 = CONCAT44((int)((ulong)local_278 >> 0x20),(int)uVar1);
    local_178 = (rax_1 << 0x20) + rdx_2;
    (local_170->frameMark).time = local_178;
    ___b_7 = (undefined1 *)((long)&(__token_3->super_ProducerBase)._vptr_ProducerBase + 1);
    local_d0 = item_3;
    local_dc = 3;
    local_1b0 = local_278;
    std::operator&(memory_order_release,__memory_order_mask);
    if (local_dc == 3) {
      *(undefined1 **)pQVar2 = ___b_7;
    }
    else if (local_dc == 5) {
      LOCK();
      *(undefined1 **)pQVar2 = ___b_7;
      UNLOCK();
    }
    else {
      *(undefined1 **)pQVar2 = ___b_7;
    }
  }
  return;
}

Assistant:

void Collect()
    {
        ZoneScopedC( Color::Red4 );

        if( m_tail == m_head ) return;

#ifdef TRACY_ON_DEMAND
        if( !GetProfiler().IsConnected() )
        {
            m_head = m_tail = 0;
            return;
        }
#endif

        while( m_tail != m_head )
        {
            GLint available;
            glGetQueryObjectiv( m_query[m_tail], GL_QUERY_RESULT_AVAILABLE, &available );
            if( !available ) return;

            uint64_t time;
            glGetQueryObjectui64v( m_query[m_tail], GL_QUERY_RESULT, &time );

            TracyLfqPrepare( QueueType::GpuTime );
            MemWrite( &item->gpuTime.gpuTime, (int64_t)time );
            MemWrite( &item->gpuTime.queryId, (uint16_t)m_tail );
            MemWrite( &item->gpuTime.context, m_context );
            TracyLfqCommit;

            m_tail = ( m_tail + 1 ) % QueryCount;
        }
    }